

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O1

bool __thiscall
SGParser::BacktrackingTokenStream<SGParser::GenericToken>::SeekTo
          (BacktrackingTokenStream<SGParser::GenericToken> *this,size_t index)

{
  ulong uVar1;
  size_t sVar2;
  StreamBlock *pSVar3;
  StreamBlock *pSVar4;
  
  uVar1 = this->pThisBlock->Index;
  if ((index < uVar1) || (sVar2 = this->pThisBlock->Count, sVar2 == 0x200 || index < uVar1 + sVar2))
  {
    if (index < this->pFirstBlock->Index) {
      return false;
    }
    pSVar3 = this->pFirstBlock;
    if (this->Pos < index) {
      return false;
    }
    do {
      pSVar4 = pSVar3;
      if (index < pSVar4->Count + pSVar4->Index) break;
      pSVar3 = pSVar4->pNext;
    } while (pSVar4->pNext != (StreamBlock *)0x0);
    this->pThisBlock = pSVar4;
  }
  this->ThisPos = index - this->pThisBlock->Index;
  return true;
}

Assistant:

bool BacktrackingTokenStream<Token>::SeekTo(size_t index) noexcept {
    // if this is not in our current block
    if (!(pThisBlock->Index <= index &&
          pThisBlock->Index + pThisBlock->Count <= index &&
          pThisBlock->Count != StreamBlock::BufferSize)) {
        // Otherwise seek from beginning
        // Check bounds
        if (index < pFirstBlock->Index || index > Pos)
            return false;
        // And seek till block that contains our index
        pThisBlock = pFirstBlock;
        while (index >= pThisBlock->Index + pThisBlock->Count && pThisBlock->pNext)
            pThisBlock = pThisBlock->pNext;
    }

    // Update index
    ThisPos = index - pThisBlock->Index;
    return true;
}